

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

void __thiscall
QMap<int,_QVariant>::QMap
          (QMap<int,_QVariant> *this,initializer_list<std::pair<int,_QVariant>_> list)

{
  iterator key;
  pair<int,_QVariant> *p;
  long lVar1;
  
  key = list._M_array;
  (this->d).d.ptr =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)0x0;
  for (lVar1 = list._M_len * 0x28; lVar1 != 0; lVar1 = lVar1 + -0x28) {
    insert(this,&key->first,&key->second);
    key = key + 1;
  }
  return;
}

Assistant:

QMap(std::initializer_list<std::pair<Key, T>> list)
    {
        for (auto &p : list)
            insert(p.first, p.second);
    }